

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    anon_unknown_59::AppendableFileImpl::~AppendableFileImpl((AppendableFileImpl *)pointer);
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }